

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::CoronaLoader::loadObject(CoronaLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  bool bVar1;
  runtime_error *prVar2;
  Ref<embree::XML> *in_RDX;
  CoronaLoader *this_01;
  allocator local_69;
  string local_68;
  FileName fileName;
  
  bVar1 = std::operator!=(&in_RDX->ptr->name,"object");
  if (bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&local_68,&in_RDX->ptr->loc);
    std::operator+(&fileName.filename,&local_68,": invalid object node");
    std::runtime_error::runtime_error(prVar2,(string *)&fileName);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = in_RDX->ptr;
  std::__cxx11::string::string((string *)&local_68,"class",&local_69);
  XML::parm(&fileName.filename,this_00,&local_68);
  this_01 = (CoronaLoader *)0x225850;
  bVar1 = std::operator!=(&fileName.filename,"file");
  std::__cxx11::string::~string((string *)&fileName);
  std::__cxx11::string::~string((string *)&local_68);
  if (!bVar1) {
    load<embree::FileName>(&fileName,this_01,in_RDX);
    FileName::operator+((FileName *)&local_68,(FileName *)xml,&fileName);
    SceneGraph::load((SceneGraph *)this,(FileName *)&local_68,false);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&fileName);
    return (Ref<embree::SceneGraph::Node>)(Node *)this;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_68,&in_RDX->ptr->loc);
  std::operator+(&fileName.filename,&local_68,": invalid object class");
  std::runtime_error::runtime_error(prVar2,(string *)&fileName);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::loadObject(const Ref<XML>& xml) 
  {
    if (xml->name != "object") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid object node");
    if (xml->parm("class") != "file")
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid object class");
    const FileName fileName = load<FileName>(xml);
    return SceneGraph::load(path+fileName);
  }